

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::forgive_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  clientinfo *ci_00;
  clientinfo *ci_01;
  char *pcVar4;
  char *pcVar5;
  stringformatter local_260;
  char local_258 [8];
  string nk;
  char local_148 [8];
  string forgivemsg;
  clientinfo *self;
  clientinfo *ci;
  int cn;
  bool usage;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = false;
  bVar2 = QServ::getlastSA(&qs);
  if (bVar2) {
    ci._4_4_ = atoi(args[1]);
    if ((ci._4_4_ < 0) || (1000 < ci._4_4_)) {
      bVar1 = true;
      goto LAB_0018ce51;
    }
  }
  else {
    ci._4_4_ = QServ::getSender(&qs);
  }
  ci_00 = QServ::getClient(&qs,ci._4_4_);
  if (ci_00 == (clientinfo *)0x0) {
    iVar3 = QServ::getSender(&qs);
    sendf(iVar3,1,"ris",0x23,"\f3Error: Player not connected");
  }
  else if ((ci_00->connected & 1U) != 0) {
    iVar3 = QServ::getSender(&qs);
    ci_01 = QServ::getClient(&qs,iVar3);
    iVar3 = QServ::getSender(&qs);
    if ((((ci._4_4_ != iVar3) && (-1 < ci._4_4_)) && (ci._4_4_ < 0x3e9)) &&
       (((ci_00 != (clientinfo *)0x0 && ((ci_00->connected & 1U) != 0)) && (args[1] != (char *)0x0))
       )) {
      if ((ci_00->state).teamkills < 1) {
        stringformatter::stringformatter(&local_260,local_258);
        pcVar4 = colorname(ci_00);
        stringformatter::operator()(&local_260,"\f3Error: %s has not teamkilled anyone yet",pcVar4);
        sendf(-1,1,"ris",0x23,local_258);
      }
      else {
        stringformatter::stringformatter((stringformatter *)(nk + 0x100),local_148);
        pcVar4 = colorname(ci_01);
        pcVar5 = colorname(ci_00);
        stringformatter::operator()
                  ((stringformatter *)(nk + 0x100),"\f0%s \f7has forgiven \f3%s",pcVar4,pcVar5);
        sendf(-1,1,"ris",0x23,local_148);
      }
    }
  }
LAB_0018ce51:
  if (bVar1) {
    iVar3 = QServ::getSender(&qs);
    pcVar4 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar3,1,"ris",0x23,pcVar4);
  }
  return;
}

Assistant:

QSERV_CALLBACK forgive_cmd(p) {
        bool usage = false;
        int cn = -1;

        if(CMD_SA) {
            cn = atoi(args[1]);
            if(cn >= 0 && cn <= 1000) {
                //if(!isalpha(cn)) {
                    forgiveprocess:
                    clientinfo *ci = qs.getClient(cn);

                    if(ci != NULL) {
                        if(ci->connected) {
                            clientinfo *self = qs.getClient(CMD_SENDER);
                            if(cn!=CMD_SENDER && cn >= 0 && cn <= 1000 && ci != NULL && ci->connected && args[1] != NULL) {
                                if(ci->state.teamkills >= 1) {
                                    defformatstring(forgivemsg)("\f0%s \f7has forgiven \f3%s", colorname(self), colorname(ci));
                                    sendf(-1, 1, "ris", N_SERVMSG, forgivemsg);
                                }
                                else {
                                    defformatstring(nk)("\f3Error: %s has not teamkilled anyone yet", colorname(ci));
                                    sendf(-1, 1, "ris", N_SERVMSG, nk);
                                }
                            }
                            
                       }
                    } else {
                        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Player not connected");
                    }
                /*} else {
                    usage = true;
                }*/
            } else {
                usage = true;
            }
        } else {
            cn = CMD_SENDER;
            goto forgiveprocess;
        }

        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }